

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v9::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,bool value)

{
  appender aVar1;
  locale_ref in_R8;
  locale_ref local_40;
  basic_format_specs<char> local_38;
  buffer<char> *local_28;
  undefined1 local_19;
  default_arg_formatter<char> *pdStack_18;
  bool value_local;
  default_arg_formatter<char> *this_local;
  
  local_28 = (this->out).super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  local_19 = value;
  pdStack_18 = this;
  basic_format_specs<char>::basic_format_specs(&local_38);
  locale_ref::locale_ref(&local_40);
  aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._1_7_ = 0;
  aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._0_1_ = value;
  aVar1 = write<char,_fmt::v9::appender,_bool,_0>
                    ((detail *)local_28,aVar1,SUB81(&local_38,0),
                     (basic_format_specs<char> *)local_40.locale_,in_R8);
  return (iterator)
         aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }